

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O3

Error asmjit::x86::FormatterInternal_formatImmShuf
                (String *sb,uint32_t u8,uint32_t bits,uint32_t count)

{
  Error EVar1;
  uint32_t i;
  uint32_t uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (count == uVar2) {
      EVar1 = String::append(sb,'}');
      return EVar1;
    }
    EVar1 = String::append(sb,'|' - (uVar2 == 0));
    if (EVar1 != 0) break;
    EVar1 = String::appendUInt(sb,(ulong)(u8 & ~(-1 << ((byte)bits & 0x1f))),0,0,0);
    if (EVar1 != 0) {
      return EVar1;
    }
    uVar2 = uVar2 + 1;
    u8 = u8 >> ((byte)bits & 0x1f);
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error FormatterInternal_formatImmShuf(String& sb, uint32_t u8, uint32_t bits, uint32_t count) noexcept {
  uint32_t mask = (1 << bits) - 1;

  for (uint32_t i = 0; i < count; i++, u8 >>= bits) {
    uint32_t value = u8 & mask;
    ASMJIT_PROPAGATE(sb.append(i == 0 ? kImmCharStart : kImmCharOr));
    ASMJIT_PROPAGATE(sb.appendUInt(value));
  }

  if (kImmCharEnd)
    ASMJIT_PROPAGATE(sb.append(kImmCharEnd));

  return kErrorOk;
}